

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall
MT32Emu::RendererImpl<short>::doRender(RendererImpl<short> *this,short *stereoStream,Bit32u len)

{
  Bit32u *pBVar1;
  Synth *pSVar2;
  Analog *pAVar3;
  Bit32u len_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)len;
  pSVar2 = (this->super_Renderer).synth;
  if (pSVar2->activated != true) {
    iVar4 = (*pSVar2->analog->_vptr_Analog[3])();
    pSVar2 = (this->super_Renderer).synth;
    pBVar1 = &pSVar2->renderedSampleCount;
    *pBVar1 = *pBVar1 + iVar4;
    pAVar3 = pSVar2->analog;
    iVar4 = (*pAVar3->_vptr_Analog[6])(pAVar3,0,0,0,0,0,0,stereoStream,uVar6);
    if ((char)iVar4 == '\0') {
      Synth::printDebug((this->super_Renderer).synth,"%s",
                        "RendererImpl: Invalid call to Analog::process()!\n");
    }
    if (stereoStream != (short *)0x0) {
      memset(stereoStream,0,(ulong)(len * 2) * 2);
    }
    Renderer::updateDisplayState(&this->super_Renderer);
    return;
  }
  if (len != 0) {
    do {
      uVar5 = (uint)uVar6;
      uVar7 = 0x1000;
      if (uVar5 < 0x1000) {
        uVar7 = uVar6;
      }
      pAVar3 = ((this->super_Renderer).synth)->analog;
      len_00 = (*pAVar3->_vptr_Analog[3])(pAVar3,uVar7);
      doRenderStreams(this,&this->tmpBuffers,len_00);
      pAVar3 = ((this->super_Renderer).synth)->analog;
      iVar4 = (*pAVar3->_vptr_Analog[6])
                        (pAVar3,stereoStream,this->tmpNonReverbLeft,this->tmpNonReverbRight,
                         this->tmpReverbDryLeft,this->tmpReverbDryRight,this->tmpReverbWetLeft,
                         this->tmpReverbWetRight,uVar7);
      if ((char)iVar4 == '\0') {
        Synth::printDebug((this->super_Renderer).synth,"%s",
                          "RendererImpl: Invalid call to Analog::process()!\n");
        if (stereoStream == (short *)0x0) {
          return;
        }
        memset(stereoStream,0,(ulong)(uVar5 * 2) * 2);
        return;
      }
      stereoStream = stereoStream + (uint)((int)uVar7 * 2);
      uVar5 = uVar5 - (int)uVar7;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRender(Sample *stereoStream, Bit32u len) {
	if (!isActivated()) {
		incRenderedSampleCount(getAnalog().getDACStreamsLength(len));
		if (!getAnalog().process(NULL, NULL, NULL, NULL, NULL, NULL, stereoStream, len)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
		}
		Synth::muteSampleBuffer(stereoStream, len << 1);
		updateDisplayState();
		return;
	}

	while (len > 0) {
		// As in AnalogOutputMode_ACCURATE mode output is upsampled, MAX_SAMPLES_PER_RUN is more than enough for the temp buffers.
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(tmpBuffers, getAnalog().getDACStreamsLength(thisPassLen));
		if (!getAnalog().process(stereoStream, tmpNonReverbLeft, tmpNonReverbRight, tmpReverbDryLeft, tmpReverbDryRight, tmpReverbWetLeft, tmpReverbWetRight, thisPassLen)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
			Synth::muteSampleBuffer(stereoStream, len << 1);
			return;
		}
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}